

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,REF_DBL *normalspacing)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  double dVar4;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL edg_norm [3];
  REF_DBL dxyz [3];
  REF_DBL dn;
  REF_INT on_node;
  REF_INT off_node;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_INT tri_nodes [27];
  int local_c4;
  REF_INT edg_nodes [27];
  int local_4c;
  REF_INT tri;
  REF_INT edg;
  REF_CELL tri_cell;
  REF_CELL edg_cell;
  REF_INT ref_malloc_init_i;
  REF_INT node;
  REF_INT *hits;
  REF_NODE ref_node;
  REF_DBL *normalspacing_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  for (edg_cell._4_4_ = 0; edg_cell._4_4_ < ref_node_00->max; edg_cell._4_4_ = edg_cell._4_4_ + 1) {
    if (((-1 < edg_cell._4_4_) && (edg_cell._4_4_ < ref_node_00->max)) &&
       (-1 < ref_node_00->global[edg_cell._4_4_])) {
      normalspacing[edg_cell._4_4_] = 0.0;
    }
  }
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
           "ref_phys_normal_spacing","malloc hits of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node_00->max << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
             "ref_phys_normal_spacing","malloc hits of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (edg_cell._0_4_ = 0; (int)edg_cell < ref_node_00->max; edg_cell._0_4_ = (int)edg_cell + 1)
      {
        *(undefined4 *)((long)__ptr + (long)(int)edg_cell * 4) = 0;
      }
      if (ref_grid->twod == 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x3f6,"ref_phys_normal_spacing",6,"implement 3D");
        ref_grid_local._4_4_ = 6;
      }
      else {
        ref_cell = ref_grid->cell[0];
        ref_cell_00 = ref_grid->cell[3];
        for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
          RVar1 = ref_cell_nodes(ref_cell,local_4c,tri_nodes + 0x1a);
          if (RVar1 == 0) {
            uVar2 = ref_layer_interior_seg_normal
                              (ref_grid,local_4c,(REF_DBL *)&ref_private_macro_code_rss_1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3df,"ref_phys_normal_spacing",(ulong)uVar2,"edge norm");
              return uVar2;
            }
            uVar2 = ref_cell_list_with2(ref_grid->cell[3],tri_nodes[0x1a],local_c4,2,tri_list,
                                        &on_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3e2,"ref_phys_normal_spacing",(ulong)uVar2,"tri with2");
              return uVar2;
            }
            if ((long)tri_list[0] != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3e3,"ref_phys_normal_spacing","edg expects one tri",1,(long)tri_list[0]);
              return 1;
            }
            uVar2 = ref_cell_nodes(ref_cell_00,on_node,tri_list + 1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3e5,"ref_phys_normal_spacing",(ulong)uVar2,"tri nodes");
              return uVar2;
            }
            iVar3 = ((tri_list[1] + ntri + tri_nodes[0]) - tri_nodes[0x1a]) - local_c4;
            dVar4 = (ref_node_00->real[iVar3 * 0xf + 2] -
                    ref_node_00->real[tri_nodes[0x1a] * 0xf + 2]) * edg_norm[1] +
                    (ref_node_00->real[iVar3 * 0xf] - ref_node_00->real[tri_nodes[0x1a] * 0xf]) *
                    _ref_private_macro_code_rss_1 +
                    (ref_node_00->real[iVar3 * 0xf + 1] -
                    ref_node_00->real[tri_nodes[0x1a] * 0xf + 1]) * edg_norm[0];
            normalspacing[tri_nodes[0x1a]] = dVar4 + normalspacing[tri_nodes[0x1a]];
            *(int *)((long)__ptr + (long)tri_nodes[0x1a] * 4) =
                 *(int *)((long)__ptr + (long)tri_nodes[0x1a] * 4) + 1;
            normalspacing[local_c4] = dVar4 + normalspacing[local_c4];
            *(int *)((long)__ptr + (long)local_c4 * 4) =
                 *(int *)((long)__ptr + (long)local_c4 * 4) + 1;
          }
        }
        for (edg_cell._4_4_ = 0; edg_cell._4_4_ < ref_node_00->max;
            edg_cell._4_4_ = edg_cell._4_4_ + 1) {
          if (((-1 < edg_cell._4_4_) && (edg_cell._4_4_ < ref_node_00->max)) &&
             ((-1 < ref_node_00->global[edg_cell._4_4_] &&
              (0 < *(int *)((long)__ptr + (long)edg_cell._4_4_ * 4))))) {
            normalspacing[edg_cell._4_4_] =
                 normalspacing[edg_cell._4_4_] /
                 (double)*(int *)((long)__ptr + (long)edg_cell._4_4_ * 4);
          }
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,normalspacing,1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x3ff,"ref_phys_normal_spacing",(ulong)ref_grid_local._4_4_,"ghost normalspacing");
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,
                                           REF_DBL *normalspacing) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { normalspacing[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ref_math_dot(dxyz, edg_norm);
      normalspacing[edg_nodes[0]] += dn;
      hits[edg_nodes[0]] += 1;
      normalspacing[edg_nodes[1]] += dn;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      normalspacing[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, normalspacing, 1), "ghost normalspacing");

  return REF_SUCCESS;
}